

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

bool __thiscall MP1Node::joinRepHandler(MP1Node *this,void *env,char *data,int size)

{
  bool bVar1;
  ostream *poVar2;
  Address local_32;
  undefined1 auStack_2c [2];
  Address replierAddr;
  int size_local;
  char *data_local;
  void *env_local;
  MP1Node *this_local;
  
  _auStack_2c = size;
  unique0x100000de = data;
  poVar2 = std::operator<<((ostream *)&std::cout,"start joinRepHandler...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (_auStack_2c < 6) {
    this_local._7_1_ = false;
  }
  else {
    Address::Address(&local_32);
    local_32.addr._0_4_ = *(undefined4 *)stack0xffffffffffffffd8;
    local_32.addr._4_2_ = *(undefined2 *)(stack0xffffffffffffffd8 + 4);
    register0x00000000 = stack0xffffffffffffffd8 + 6;
    _auStack_2c = _auStack_2c + -6;
    bVar1 = recvMembershipList(this,env,register0x00000000,_auStack_2c,"JOINREP");
    if (bVar1) {
      this->memberNode->inGroup = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"...end joinRepHandler.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MP1Node::joinRepHandler(void *env, char *data, int size) {
    cout << "start joinRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(replierAddr.addr, data, sizeof(memberNode->addr.addr));          //extract replier's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    if (!recvMembershipList(env, data, size, "JOINREP")) {
        return false;
    }
    this->memberNode->inGroup = true;

    cout << "...end joinRepHandler." << endl;
    return true;
}